

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void luaS_init(lua_State *L)

{
  undefined1 auVar1 [16];
  global_State *pgVar2;
  undefined8 uVar3;
  TString *o;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  pgVar2 = L->l_G;
  luaS_resize(L,0x80);
  o = luaS_newlstr(L,"not enough memory",0x11);
  pgVar2->memerrmsg = o;
  if ((o->tt & 0xe) < 10) {
    luaC_fix(L,(GCObject *)o);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pgVar2->memerrmsg;
    auVar5 = vpbroadcastq_avx512f(auVar1);
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar7 = vpbroadcastq_avx512f(ZEXT816(0x35));
    auVar8 = vpbroadcastq_avx512f(ZEXT816(8));
    lVar4 = 0x38;
    do {
      uVar3 = vpcmpuq_avx512f(auVar6,auVar7,1);
      auVar9 = vpsllq_avx512f(auVar6,4);
      auVar6 = vpaddq_avx512f(auVar6,auVar8);
      lVar4 = lVar4 + -8;
      vpscatterqq_avx512f(ZEXT864(pgVar2->strcache) + auVar9,uVar3,auVar5);
      vpscatterqq_avx512f(ZEXT864(pgVar2->strcache) + ZEXT864(8) + auVar9,uVar3,auVar5);
    } while (lVar4 != 0);
    return;
  }
  __assert_fail("(((g->memerrmsg)->tt) & 0x0F) < (9+1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                ,0x7a,"void luaS_init(lua_State *)");
}

Assistant:

void luaS_init (lua_State *L) {
  global_State *g = G(L);
  int i, j;
  luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
  for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
    for (j = 0; j < STRCACHE_M; j++)
      g->strcache[i][j] = g->memerrmsg;
}